

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Node * __thiscall JSON::Parser::parse(Parser *this)

{
  int iVar1;
  initializer_list<JSON::Node> __l;
  Node body;
  Node node;
  allocator_type local_1a9;
  char *local_1a8;
  size_type local_1a0;
  char local_198;
  undefined7 uStack_197;
  int iStack_190;
  int iStack_18c;
  string local_188;
  undefined1 local_168 [8];
  char *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  int iStack_148;
  int iStack_144;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_120;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_108;
  undefined1 local_f0 [40];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_a8;
  Node local_90;
  
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
  local_168._0_4_ = 0x30;
  if (local_1a8 == &local_198) {
    iStack_148 = iStack_190;
    iStack_144 = iStack_18c;
    local_160 = local_158._M_local_buf + 8;
  }
  else {
    local_160 = local_1a8;
  }
  local_158._9_7_ = uStack_197;
  local_158._M_local_buf[8] = local_198;
  local_158._M_allocated_capacity = local_1a0;
  local_1a0 = 0;
  local_198 = '\0';
  local_140._M_p = (pointer)0x0;
  (this->currentToken).type = START_F;
  local_1a8 = &local_198;
  std::__cxx11::string::operator=((string *)&(this->currentToken).value,(string *)&local_160);
  *(pointer *)&(this->currentToken).start = local_140._M_p;
  if (local_160 != local_158._M_local_buf + 8) {
    operator_delete(local_160,local_158._8_8_ + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  (this->lastToken).type = (this->currentToken).type;
  std::__cxx11::string::_M_assign((string *)&(this->lastToken).value);
  iVar1 = (this->currentToken).end;
  (this->lastToken).start = (this->currentToken).start;
  (this->lastToken).end = iVar1;
  this->pos = 0;
  next(this);
  parseNode((Node *)local_168,this);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,NodeType::Root_abi_cxx11_,DAT_0010e310 + NodeType::Root_abi_cxx11_
            );
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,CONCAT44(local_168._4_4_,local_168._0_4_),
             local_160 + CONCAT44(local_168._4_4_,local_168._0_4_));
  local_f0._32_4_ = iStack_148;
  local_f0._36_4_ = iStack_144;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,local_140._M_p,local_140._M_p + local_138);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector(&local_a8,&local_120);
  __l._M_len = 1;
  __l._M_array = (iterator)local_f0;
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector(&local_108,__l,&local_1a9);
  Node::Node(&local_90,&local_188,&local_108,0,this->length);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_108);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&this->ast);
  (this->ast).start = local_90.start;
  (this->ast).end = local_90.end;
  std::__cxx11::string::_M_assign((string *)&(this->ast).rawValue);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::operator=
            (&(this->ast).children,&local_90.children);
  if ((this->currentToken).type == END_F) {
    std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_90.children);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.rawValue._M_dataplus._M_p != &local_90.rawValue.field_2) {
      operator_delete(local_90.rawValue._M_dataplus._M_p,
                      local_90.rawValue.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.type._M_dataplus._M_p != &local_90.type.field_2) {
      operator_delete(local_90.type._M_dataplus._M_p,local_90.type.field_2._M_allocated_capacity + 1
                     );
    }
    std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_p != &local_130) {
      operator_delete(local_140._M_p,local_130._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_168._4_4_,local_168._0_4_) != &local_158) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_168._4_4_,local_168._0_4_),
                      local_158._M_allocated_capacity + 1);
    }
    return &this->ast;
  }
  unexpected(this,&this->currentToken);
}

Assistant:

Node &Parser::parse() {
        currentToken = Token(START_F, "", 0, 0);
        lastToken = currentToken;
        pos = 0;

        next();
        Node body = parseNode();
        Node node(NodeType::Root, vector<Node>{body}, 0, length);
        ast = node;
        if (currentToken.type != END_F) {
            unexpected(currentToken);
        }
        return ast;
    }